

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_print_help(nn_parse_context *ctx,FILE *stream)

{
  int iVar1;
  nn_option *opt_00;
  size_t sVar2;
  char *local_38;
  char *cursor;
  char *last_group;
  nn_option *opt;
  int optlen;
  int i;
  FILE *stream_local;
  nn_parse_context *ctx_local;
  
  fprintf((FILE *)stream,"Usage:\n");
  nn_print_usage(ctx,stream);
  fprintf((FILE *)stream,"\n%s\n",ctx->def->short_description);
  cursor = (char *)0x0;
  opt._4_4_ = 0;
  while (opt_00 = ctx->options + opt._4_4_, opt_00->longname != (char *)0x0) {
    if (((cursor == (char *)0x0) || (cursor != opt_00->group)) ||
       (iVar1 = strcmp(cursor,opt_00->group), iVar1 != 0)) {
      fprintf((FILE *)stream,"\n");
      fprintf((FILE *)stream,"%s:\n",opt_00->group);
      cursor = opt_00->group;
    }
    fprintf((FILE *)stream," --%s",opt_00->longname);
    sVar2 = strlen(opt_00->longname);
    opt._0_4_ = (int)sVar2 + 3;
    if (opt_00->shortname != '\0') {
      fprintf((FILE *)stream,",-%c",(ulong)(uint)(int)opt_00->shortname);
      opt._0_4_ = (int)sVar2 + 6;
    }
    iVar1 = nn_has_arg(opt_00);
    if (iVar1 != 0) {
      if (opt_00->metavar == (char *)0x0) {
        fprintf((FILE *)stream," ARG");
        opt._0_4_ = (int)opt + 4;
      }
      else {
        fprintf((FILE *)stream," %s",opt_00->metavar);
        sVar2 = strlen(opt_00->metavar);
        opt._0_4_ = (int)opt + (int)sVar2 + 1;
      }
    }
    if ((int)opt < 0x17) {
      fputs("\n                        " + (long)(int)opt + 1,(FILE *)stream);
      local_38 = nn_print_line(stream,opt_00->description,0x38);
    }
    else {
      local_38 = opt_00->description;
    }
    for (; *local_38 != '\0'; local_38 = nn_print_line(stream,local_38,0x38)) {
      fprintf((FILE *)stream,"\n                        ");
    }
    fprintf((FILE *)stream,"\n");
    opt._4_4_ = opt._4_4_ + 1;
  }
  return;
}

Assistant:

static void nn_print_help (struct nn_parse_context *ctx, FILE *stream)
{
    int i;
    int optlen;
    struct nn_option *opt;
    char *last_group;
    char *cursor;

    fprintf (stream, "Usage:\n");
    nn_print_usage (ctx, stream);
    fprintf (stream, "\n%s\n", ctx->def->short_description);

    last_group = NULL;
    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (!last_group || last_group != opt->group ||
            strcmp (last_group, opt->group))
        {
            fprintf (stream, "\n");
            fprintf (stream, "%s:\n", opt->group);
            last_group = opt->group;
        }
        fprintf (stream, " --%s", opt->longname);
        optlen = 3 + strlen (opt->longname);
        if (opt->shortname) {
            fprintf (stream, ",-%c", opt->shortname);
            optlen += 3;
        }
        if (nn_has_arg (opt)) {
            if (opt->metavar) {
                fprintf (stream, " %s", opt->metavar);
                optlen += strlen (opt->metavar) + 1;
            } else {
                fprintf (stream, " ARG");
                optlen += 4;
            }
        }
        if (optlen < 23) {
            fputs (&"                        "[optlen], stream);
            cursor = nn_print_line (stream, opt->description, 80-24);
        } else {
            cursor = opt->description;
        }
        while (*cursor) {
            fprintf (stream, "\n                        ");
            cursor = nn_print_line (stream, cursor, 80-24);
        }
        fprintf (stream, "\n");
    }
}